

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

void __thiscall
cppqc::Generator<std::tuple<Rectangle>>::Generator<cppqc::detail::TupleGenerator<Rectangle>>
          (Generator<std::tuple<Rectangle>_> *this,TupleGenerator<Rectangle> *gm)

{
  unique_ptr<cppqc::detail::GenConcept<std::tuple<Rectangle>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<Rectangle>_>_>_>
  *this_00;
  GenModel<cppqc::detail::TupleGenerator<Rectangle>_> *in_RSI;
  pointer in_RDI;
  TupleGenerator<Rectangle> *in_stack_ffffffffffffffe8;
  
  this_00 = (unique_ptr<cppqc::detail::GenConcept<std::tuple<Rectangle>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<Rectangle>_>_>_>
             *)operator_new(0x10);
  detail::TupleGenerator<Rectangle>::TupleGenerator
            ((TupleGenerator<Rectangle> *)this_00,(TupleGenerator<Rectangle> *)in_RDI);
  Generator<std::tuple<Rectangle>_>::GenModel<cppqc::detail::TupleGenerator<Rectangle>_>::GenModel
            (in_RSI,in_stack_ffffffffffffffe8);
  std::
  unique_ptr<cppqc::detail::GenConcept<std::tuple<Rectangle>>,std::default_delete<cppqc::detail::GenConcept<std::tuple<Rectangle>>>>
  ::unique_ptr<std::default_delete<cppqc::detail::GenConcept<std::tuple<Rectangle>>>,void>
            (this_00,in_RDI);
  detail::TupleGenerator<Rectangle>::~TupleGenerator((TupleGenerator<Rectangle> *)0x116f7a);
  return;
}

Assistant:

Generator(const GeneratorModel& gm)
      : m_gen{new GenModel<GeneratorModel>(gm)} {}